

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakHash.c
# Opt level: O0

HashReturn Keccak_HashUpdate(Keccak_HashInstance *instance,BitSequence *data,BitLength databitlen)

{
  ushort uVar1;
  HashReturn HVar2;
  ulong in_RDX;
  size_t in_RSI;
  uchar *in_RDI;
  uchar oneByte [1];
  unsigned_short delimitedLastBytes;
  uchar lastByte;
  HashReturn ret;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RDX & 7) == 0) {
    HVar2 = KeccakWidth1600_SpongeAbsorb
                      ((KeccakWidth1600_SpongeInstance *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI);
  }
  else {
    HVar2 = KeccakWidth1600_SpongeAbsorb
                      ((KeccakWidth1600_SpongeInstance *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI);
    if (HVar2 == KECCAK_SUCCESS) {
      uVar1 = (ushort)in_RDI[0xd8] << ((byte)in_RDX & 7);
      if ((uVar1 & 0xff00) == 0) {
        in_RDI[0xd8] = *(byte *)(in_RSI + (in_RDX >> 3)) & (char)(1 << ((byte)in_RDX & 7)) - 1U |
                       (byte)uVar1;
      }
      else {
        HVar2 = KeccakWidth1600_SpongeAbsorb
                          ((KeccakWidth1600_SpongeInstance *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_RSI);
        in_RDI[0xd8] = (uchar)(uVar1 >> 8);
      }
    }
  }
  return HVar2;
}

Assistant:

HashReturn Keccak_HashUpdate(Keccak_HashInstance *instance, const BitSequence *data, BitLength databitlen)
{
    if ((databitlen % 8) == 0)
        return (HashReturn)KeccakWidth1600_SpongeAbsorb(&instance->sponge, data, databitlen/8);
    else {
        HashReturn ret = (HashReturn)KeccakWidth1600_SpongeAbsorb(&instance->sponge, data, databitlen/8);
        if (ret == KECCAK_SUCCESS) {
            /* The last partial byte is assumed to be aligned on the least significant bits */
            unsigned char lastByte = data[databitlen/8];
            /* Concatenate the last few bits provided here with those of the suffix */
            unsigned short delimitedLastBytes = (unsigned short)((unsigned short)(lastByte & ((1 << (databitlen % 8)) - 1)) | ((unsigned short)instance->delimitedSuffix << (databitlen % 8)));
            if ((delimitedLastBytes & 0xFF00) == 0x0000) {
                instance->delimitedSuffix = delimitedLastBytes & 0xFF;
            }
            else {
                unsigned char oneByte[1];
                oneByte[0] = delimitedLastBytes & 0xFF;
                ret = (HashReturn)KeccakWidth1600_SpongeAbsorb(&instance->sponge, oneByte, 1);
                instance->delimitedSuffix = (delimitedLastBytes >> 8) & 0xFF;
            }
        }
        return ret;
    }
}